

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

size_type __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
BucketNumber(InnerMap *this,MapKey *k)

{
  size_t sVar1;
  size_type h;
  MapKey *k_local;
  InnerMap *this_local;
  
  sVar1 = hash<google::protobuf::MapKey>::operator()((hash<google::protobuf::MapKey> *)this,k);
  return sVar1 * (this->seed_ | 1) & this->num_buckets_ - 1;
}

Assistant:

size_type BucketNumber(const Key& k) const {
      // We inherit from hasher, so one-arg operator() provides a hash function.
      size_type h = (*const_cast<InnerMap*>(this))(k);
      // To help prevent people from making assumptions about the hash function,
      // we use the seed differently depending on NDEBUG.  The default hash
      // function, the seeding, etc., are all likely to change in the future.
#ifndef NDEBUG
      return (h * (seed_ | 1)) & (num_buckets_ - 1);
#else
      return (h + seed_) & (num_buckets_ - 1);
#endif
    }